

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferBlock::Read(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  element_type *peVar1;
  _func_int *p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  
  if (this->_buffer_start == (char *)0x0) {
    return 0;
  }
  if ((this->_can_read == false) && (this->_read == this->_write)) {
    return 0;
  }
  if (len == 0) {
    len = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(this);
  }
  pcVar5 = this->_read;
  pcVar8 = this->_write;
  if (pcVar5 < pcVar8) {
    uVar6 = (int)pcVar8 - (int)pcVar5;
  }
  else {
    if ((pcVar5 != pcVar8) || (this->_can_read != false)) {
      uVar6 = *(int *)&this->_buffer_end - (int)pcVar5;
      uVar7 = (int)pcVar8 - (int)this->_buffer_start;
      pcVar8 = (char *)0x0;
      if (uVar7 != 0) {
        pcVar8 = this->_buffer_start;
      }
      goto LAB_00118238;
    }
    pcVar5 = (char *)0x0;
    uVar6 = 0;
  }
  uVar7 = 0;
  pcVar8 = (char *)0x0;
LAB_00118238:
  if (len < uVar7 + uVar6) {
    peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (peVar1->super_Buffer)._vptr_Buffer[10];
    if (len < uVar6) {
      uVar6 = (*p_Var2)();
    }
    else {
      iVar3 = (*p_Var2)(peVar1,pcVar5,(ulong)uVar6);
      peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (*(peVar1->super_Buffer)._vptr_Buffer[10])(peVar1,pcVar8,(ulong)(len - uVar6));
      uVar6 = iVar4 + iVar3;
    }
  }
  else {
    peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*(peVar1->super_Buffer)._vptr_Buffer[10])(peVar1,pcVar5,(ulong)uVar6);
    peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = (*(peVar1->super_Buffer)._vptr_Buffer[10])(peVar1,pcVar8,(ulong)uVar7);
    uVar6 = iVar4 + iVar3;
  }
  (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[6])(this,(ulong)uVar6);
  return uVar6;
}

Assistant:

uint32_t BufferBlock::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        return 0;
    }

    if (len == 0) {
        len = GetCanReadLength();
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t read_done_size = 0;
    
    // read all data
    if (len >= total_size) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len - len1);

    // write part of data
    } else {
        read_done_size += buffer->Write((char*)data1, len);
    }

    MoveReadPt(read_done_size);
    return read_done_size;
}